

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsg_model.c
# Opt level: O1

fsg_model_t * fsg_model_init(char *name,logmath_t *lmath,float32 lw,int32 n_state)

{
  fsg_model_t *pfVar1;
  listelem_alloc_t *plVar2;
  char *pcVar3;
  trans_list_t *ptVar4;
  
  pfVar1 = (fsg_model_t *)
           __ckd_calloc__(1,0x58,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/fsg_model.c"
                          ,0x1f6);
  pfVar1->refcount = 1;
  plVar2 = listelem_alloc_init(0x10);
  pfVar1->link_alloc = plVar2;
  pfVar1->lmath = lmath;
  if (name == (char *)0x0) {
    pcVar3 = (char *)0x0;
  }
  else {
    pcVar3 = __ckd_salloc__(name,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/fsg_model.c"
                            ,0x1fa);
  }
  pfVar1->name = pcVar3;
  pfVar1->n_state = n_state;
  pfVar1->lw = lw;
  ptVar4 = (trans_list_t *)
           __ckd_calloc__((long)n_state,0x10,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/fsg_model.c"
                          ,0x1fe);
  pfVar1->trans = ptVar4;
  return pfVar1;
}

Assistant:

fsg_model_t *
fsg_model_init(char const *name, logmath_t * lmath, float32 lw,
               int32 n_state)
{
    fsg_model_t *fsg;

    /* Allocate basic stuff. */
    fsg = ckd_calloc(1, sizeof(*fsg));
    fsg->refcount = 1;
    fsg->link_alloc = listelem_alloc_init(sizeof(fsg_link_t));
    fsg->lmath = lmath;
    fsg->name = name ? ckd_salloc(name) : NULL;
    fsg->n_state = n_state;
    fsg->lw = lw;

    fsg->trans = ckd_calloc(fsg->n_state, sizeof(*fsg->trans));

    return fsg;
}